

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_collective.hpp
# Opt level: O1

void mxx::impl::scatterv_big<char>
               (char *msgs,vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes,char *out,
               size_t recv_size,int root,comm *comm)

{
  size_t __n;
  MPI_Comm poVar1;
  MPI_Datatype poVar2;
  comm *pcVar3;
  ulong uVar4;
  long lVar5;
  datatype dt_1;
  datatype dt;
  requests reqs;
  datatype local_a0;
  char *local_88;
  char *local_80;
  datatype local_78;
  undefined1 local_60 [8];
  pointer local_58;
  pointer ppoStack_50;
  pointer local_48;
  comm *local_40;
  ulong local_38;
  
  local_60 = (undefined1  [8])&PTR__requests_00180cb0;
  local_58 = (pointer)0x0;
  ppoStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  local_88 = out;
  local_80 = msgs;
  if (comm->m_rank == root) {
    if (0 < comm->m_size) {
      uVar4 = 0;
      lVar5 = 0;
      local_40 = comm;
      local_38 = (ulong)(uint)root;
      do {
        pcVar3 = local_40;
        local_a0._vptr_datatype = (_func_int **)&PTR__datatype_00180c80;
        local_a0.mpitype = (MPI_Datatype)&ompi_mpi_char;
        local_a0.builtin = true;
        datatype::contiguous
                  (&local_78,&local_a0,
                   (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar4]);
        datatype::~datatype(&local_a0);
        poVar2 = local_78.mpitype;
        if (local_38 == uVar4) {
          __n = (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar4];
          if (__n != 0) {
            memmove(local_88,local_80 + lVar5,__n);
          }
        }
        else {
          poVar1 = pcVar3->mpi_comm;
          local_a0._vptr_datatype = (_func_int **)0x0;
          std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::
          emplace_back<ompi_request_t*>
                    ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&local_58,
                     (ompi_request_t **)&local_a0);
          MPI_Isend(local_80 + lVar5,1,poVar2,uVar4 & 0xffffffff,0x4d2,poVar1,ppoStack_50 + -1);
        }
        lVar5 = lVar5 + (sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                        _M_impl.super__Vector_impl_data._M_start[uVar4];
        datatype::~datatype(&local_78);
        uVar4 = uVar4 + 1;
      } while ((long)uVar4 < (long)local_40->m_size);
    }
  }
  else {
    local_a0._vptr_datatype = (_func_int **)&PTR__datatype_00180c80;
    local_a0.mpitype = (MPI_Datatype)&ompi_mpi_char;
    local_a0.builtin = true;
    datatype::contiguous(&local_78,&local_a0,recv_size);
    datatype::~datatype(&local_a0);
    poVar1 = comm->mpi_comm;
    local_a0._vptr_datatype = (_func_int **)0x0;
    std::vector<ompi_request_t*,std::allocator<ompi_request_t*>>::emplace_back<ompi_request_t*>
              ((vector<ompi_request_t*,std::allocator<ompi_request_t*>> *)&local_58,
               (ompi_request_t **)&local_a0);
    MPI_Irecv(local_88,1,local_78.mpitype,(ulong)(uint)root,0x4d2,poVar1,ppoStack_50 + -1);
    datatype::~datatype(&local_78);
  }
  MPI_Waitall((ulong)((long)ppoStack_50 - (long)local_58) >> 3,local_58,0);
  requests::~requests((requests *)local_60);
  return;
}

Assistant:

void scatterv_big(const T* msgs, const std::vector<size_t>& sizes, T* out, size_t recv_size, int root, const mxx::comm& comm = mxx::comm()) {
    // implementation of scatter for messages sizes that exceed MAX_INT
    mxx::requests reqs;
    int tag = 1234; // TODO: handle tags somewhere (as attributes in the comm?)
    if (comm.rank() == root) {
        std::size_t offset = 0;
        for (int i = 0; i < comm.size(); ++i) {
            mxx::datatype dt = mxx::get_datatype<T>().contiguous(sizes[i]);
            if (i == root) {
                // copy input into output
                std::copy(msgs+offset, msgs+offset+sizes[i], out);
            } else {
                MPI_Isend(const_cast<T*>(msgs)+offset, 1, dt.type(), i, tag, comm, &reqs.add());
            }
            offset += sizes[i];
        }
    } else {
        // create custom datatype to encapsulate the whole message
        mxx::datatype dt = mxx::get_datatype<T>().contiguous(recv_size);
        MPI_Irecv(const_cast<T*>(out), 1, dt.type(), root, tag, comm, &reqs.add());
    }
    reqs.wait();
}